

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int waitforcliforudpsrv(SOCKET socksrv,SOCKET *pSockCli,int timeout)

{
  int iVar1;
  ssize_t sVar2;
  fd_set *__arr;
  undefined1 auStack_10568 [4];
  uint __i;
  char buf [65535];
  char service [32];
  char hostname [1025];
  socklen_t local_13c;
  undefined1 local_138 [4];
  socklen_t addrlen;
  sockaddr_storage addr;
  timeval tv;
  undefined1 local_a0 [4];
  int iResult;
  fd_set sock_set;
  int timeout_local;
  SOCKET *pSockCli_local;
  SOCKET socksrv_local;
  
  sock_set.fds_bits[0xf]._4_4_ = timeout;
  local_13c = 0x80;
  addr.__ss_align = (unsigned_long)(timeout / 1000);
  *pSockCli = -1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    sock_set.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  sock_set.fds_bits[(long)(socksrv / 0x40) + -1] =
       1L << ((byte)((long)socksrv % 0x40) & 0x3f) | sock_set.fds_bits[(long)(socksrv / 0x40) + -1];
  if (sock_set.fds_bits[0xf]._4_4_ == 0) {
    tv.tv_usec._4_4_ =
         select(socksrv + 1,(fd_set *)local_a0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  }
  else {
    tv.tv_usec._4_4_ =
         select(socksrv + 1,(fd_set *)local_a0,(fd_set *)0x0,(fd_set *)0x0,
                (timeval *)&addr.__ss_align);
  }
  sock_set.fds_bits[(long)(socksrv / 0x40) + -1] =
       (1L << ((byte)((long)socksrv % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       sock_set.fds_bits[(long)(socksrv / 0x40) + -1];
  if (tv.tv_usec._4_4_ == -1) {
    pSockCli_local._4_4_ = 1;
  }
  else if (tv.tv_usec._4_4_ == 0) {
    pSockCli_local._4_4_ = 2;
  }
  else {
    memset(local_138,0,0x80);
    local_13c = 0x80;
    sVar2 = recvfrom(socksrv,auStack_10568,0xffff,0,(sockaddr *)local_138,&local_13c);
    if (sVar2 < 0) {
      pSockCli_local._4_4_ = 1;
    }
    else {
      iVar1 = connect(socksrv,(sockaddr *)local_138,local_13c);
      if (iVar1 == 0) {
        iVar1 = getnameinfo((sockaddr *)local_138,local_13c,service + 0x18,0x401,buf + 0xfff8,0x20,3
                           );
        if (iVar1 == 0) {
          *pSockCli = socksrv;
          pSockCli_local._4_4_ = 0;
        }
        else {
          pSockCli_local._4_4_ = 1;
        }
      }
      else {
        pSockCli_local._4_4_ = 1;
      }
    }
  }
  return pSockCli_local._4_4_;
}

Assistant:

inline int waitforcliforudpsrv(SOCKET socksrv, SOCKET* pSockCli, int timeout)
{
	fd_set sock_set;
	int iResult = SOCKET_ERROR;
	struct timeval tv;
	struct sockaddr_storage addr;
	socklen_t addrlen = sizeof(struct sockaddr_storage);
	char hostname[NI_MAXHOST];
	char service[NI_MAXSERV];
	char buf[65535];

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	*pSockCli = INVALID_SOCKET;

	// Initialize a fd_set and add the server socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(socksrv, &sock_set);

	// Wait for the readability of the socket in the fd_set, with a timeout.
	if (timeout != 0)
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, &tv);
	}
	else
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, NULL);
	}

	// Remove the server socket from the set.
	// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
	// sufficient to know what happened.
	FD_CLR(socksrv, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{ 
		PRINT_DEBUG_MESSAGE_OSNET(("waitforcliforudpsrv message (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select timed out. ", 
			(int)socksrv, timeout));
		return EXIT_TIMEOUT;
	}

	// First datagram will be lost...
	memset(&addr, 0, sizeof(addr));
	addrlen = sizeof(addr);
	if (recvfrom(socksrv, buf, sizeof(buf), 0, (struct sockaddr*)&addr, (socklen_t*)&addrlen) < 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	// Should create a new socket connected to that client...?

	//// Create a UDP IPv4 socket.
	//*pSockCli = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	//if (*pSockCli == INVALID_SOCKET)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	return EXIT_FAILURE;
	//}

	//// Configure timeouts for send and recv.
	//if (setsockettimeouts(*pSockCli, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	closesocket(*pSockCli);
	//	return EXIT_FAILURE;
	//}
	
	// Set defaults for recv()... and send()...
	//if (connect(*pSockCli, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	if (connect(socksrv, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	// Display hostname and service.
	if (getnameinfo((struct sockaddr*)&addr, addrlen, hostname, NI_MAXHOST, service,
		NI_MAXSERV, NI_NUMERICHOST|NI_NUMERICSERV) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"getnameinfo failed. ", 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Accepted connection from host %s and port %s\n", hostname, service));

	*pSockCli = socksrv;

	return EXIT_SUCCESS;
}